

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::columnsAboutToBeRemoved
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  QItemSelectionModel *pQVar7;
  parameter_type pQVar8;
  arrow_operator_result ppQVar9;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  QItemSelectionModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *q;
  QModelIndex br;
  QModelIndex tl;
  QModelIndex old;
  undefined4 in_stack_fffffffffffffe08;
  SelectionFlag in_stack_fffffffffffffe0c;
  QModelIndex *in_stack_fffffffffffffe10;
  QItemSelectionModelPrivate *this_00;
  QPersistentModelIndex *in_stack_fffffffffffffe20;
  QModelIndex *bottomRight;
  QModelIndex *topLeft;
  QItemSelection *this_01;
  uint local_134;
  undefined1 local_130 [24];
  QItemSelection local_118;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_e8;
  undefined1 local_80 [24];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  bVar3 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffffe10);
  bVar2 = false;
  if (bVar3) {
    QPersistentModelIndex::parent(in_stack_fffffffffffffe20);
    bVar3 = ::operator==(in_stack_fffffffffffffe10,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bVar2 = false;
    if (bVar3) {
      iVar6 = QPersistentModelIndex::column
                        ((QPersistentModelIndex *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar2 = false;
      if ((int)in_EDX <= iVar6) {
        iVar6 = QPersistentModelIndex::column
                          ((QPersistentModelIndex *)
                           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar2 = iVar6 <= in_ECX;
      }
    }
  }
  if (bVar2) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffe20);
    if ((int)in_EDX < 1) {
      pQVar8 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
               ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                        *)in_stack_fffffffffffffe10);
      bVar2 = false;
      if (pQVar8 != (parameter_type)0x0) {
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffe10);
        pQVar1 = *ppQVar9;
        QModelIndex::QModelIndex((QModelIndex *)0x828452);
        iVar6 = (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,local_68);
        bVar2 = in_ECX < iVar6 + -1;
      }
      if (bVar2) {
        ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                  ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)in_stack_fffffffffffffe10);
        pQVar1 = *ppQVar9;
        uVar4 = QModelIndex::row((QModelIndex *)&local_38);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_80,pQVar1,(ulong)uVar4,(ulong)(in_ECX + 1),in_RSI);
        QPersistentModelIndex::operator=
                  ((QPersistentModelIndex *)in_stack_fffffffffffffe10,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
      else {
        QModelIndex::QModelIndex((QModelIndex *)0x8284fc);
        QPersistentModelIndex::operator=
                  ((QPersistentModelIndex *)in_stack_fffffffffffffe10,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
    }
    else {
      ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                              *)in_stack_fffffffffffffe10);
      pQVar1 = *ppQVar9;
      uVar4 = QModelIndex::row((QModelIndex *)&local_38);
      (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                (local_50,pQVar1,(ulong)uVar4,(ulong)(in_EDX - 1),in_RSI);
      QPersistentModelIndex::operator=
                ((QPersistentModelIndex *)in_stack_fffffffffffffe10,
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffe20);
    QItemSelectionModel::currentChanged
              ((QItemSelectionModel *)in_stack_fffffffffffffe10,
               (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (QModelIndex *)0x82855d);
    iVar6 = QPersistentModelIndex::row
                      ((QPersistentModelIndex *)
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    iVar5 = QModelIndex::row((QModelIndex *)&local_38);
    if (iVar6 != iVar5) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffe20);
      QItemSelectionModel::currentRowChanged
                ((QItemSelectionModel *)in_stack_fffffffffffffe10,
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (QModelIndex *)0x8285cf);
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffe20);
    QItemSelectionModel::currentColumnChanged
              ((QItemSelectionModel *)in_stack_fffffffffffffe10,
               (QModelIndex *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (QModelIndex *)0x828612);
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QItemSelectionModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                          *)&DAT_aaaaaaaaaaaaaaaa);
  topLeft = (QModelIndex *)&local_f8;
  (*((*ppQVar9)->super_QObject)._vptr_QObject[0xc])(topLeft,*ppQVar9,0,(ulong)in_EDX,in_RSI);
  local_118.super_QList<QItemSelectionRange>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.super_QList<QItemSelectionRange>.d.size = (qsizetype)this_00;
  ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                          *)this_00);
  bottomRight = (QModelIndex *)*ppQVar9;
  ppQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                          *)this_00);
  iVar6 = (*((*ppQVar9)->super_QObject)._vptr_QObject[0xf])(*ppQVar9,in_RSI);
  this_01 = &local_118;
  (**(code **)(*(long *)bottomRight + 0x60))(this_01,bottomRight,iVar6 + -1,in_ECX,in_RSI);
  QItemSelection::QItemSelection(this_01,topLeft,bottomRight);
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags
            ((QFlags<QItemSelectionModel::SelectionFlag> *)this_00,in_stack_fffffffffffffe0c);
  (*(pQVar7->super_QObject)._vptr_QObject[0xe])(pQVar7,local_130,(ulong)local_134);
  QItemSelection::~QItemSelection((QItemSelection *)0x828756);
  finalize(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModelPrivate::columnsAboutToBeRemoved(const QModelIndex &parent,
                                                            int start, int end)
{
    Q_Q(QItemSelectionModel);

    // update current index
    if (currentIndex.isValid() && parent == currentIndex.parent()
        && currentIndex.column() >= start && currentIndex.column() <= end) {
        QModelIndex old = currentIndex;
        if (start > 0) {
            // there are columns to the left of the change
            currentIndex = model->index(old.row(), start - 1, parent);
        } else if (model.value() && end < model->columnCount() - 1) {
            // there are columns to the right of the change
            currentIndex = model->index(old.row(), end + 1, parent);
        } else {
            // there are no columns left in the table
            currentIndex = QModelIndex();
        }
        emit q->currentChanged(currentIndex, old);
        if (currentIndex.row() != old.row())
            emit q->currentRowChanged(currentIndex, old);
        emit q->currentColumnChanged(currentIndex, old);
    }

    // update selections
    QModelIndex tl = model->index(0, start, parent);
    QModelIndex br = model->index(model->rowCount(parent) - 1, end, parent);
    q->select(QItemSelection(tl, br), QItemSelectionModel::Deselect);
    finalize();
}